

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O1

from_chars_result
duckdb_fast_float::from_chars<float>
          (char *first,char *last,float *value,bool strict,char decimal_separator,chars_format fmt)

{
  char cVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  from_chars_result fVar13;
  from_chars_result fVar14;
  from_chars_result fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined8 unaff_RBP;
  byte *pbVar24;
  byte *pbVar25;
  int iVar26;
  uint uVar27;
  char cVar28;
  float fVar29;
  byte *pbVar30;
  int iVar31;
  ulong in_R10;
  long lVar32;
  ulong uVar33;
  byte *unaff_R13;
  undefined7 uVar35;
  byte *pbVar34;
  byte *pbVar36;
  long lVar37;
  bool bVar38;
  bool bVar39;
  float fVar40;
  adjusted_mantissa aVar41;
  from_chars_result fVar42;
  byte *local_40;
  
  if (first == last) {
    fVar42._8_8_ = 0x16;
    fVar42.ptr = first;
    return fVar42;
  }
  cVar1 = *first;
  pbVar24 = (byte *)CONCAT71((int7)((ulong)unaff_RBP >> 8),cVar1);
  pbVar30 = (byte *)first;
  if ((cVar1 != '-') ||
     ((pbVar30 = (byte *)(first + 1), pbVar30 != (byte *)last &&
      (iVar31 = (int)CONCAT71((int7)((ulong)value >> 8),*pbVar30) + -0x30, bVar38 = 9 < (byte)iVar31
      , in_R10 = (ulong)CONCAT31((int3)((uint)iVar31 >> 8),bVar38),
      *pbVar30 == decimal_separator || !bVar38)))) {
    bVar2 = *pbVar30;
    in_R10 = 0;
    pbVar25 = pbVar30;
    if ((byte)(bVar2 - 0x30) < 10) {
      do {
        pbVar36 = pbVar25 + 1;
        if (((pbVar36 != (byte *)last) && (*pbVar36 == 0x5f)) &&
           ((strict ||
            ((pbVar36 = pbVar25 + 2, pbVar36 == (byte *)last || (9 < (byte)(*pbVar36 - 0x30))))))) {
          bVar39 = false;
          bVar38 = false;
          goto LAB_0029af52;
        }
        in_R10 = ((ulong)bVar2 + in_R10 * 10) - 0x30;
        bVar38 = pbVar36 == (byte *)last;
      } while ((!bVar38) && (bVar2 = *pbVar36, pbVar25 = pbVar36, (byte)(bVar2 - 0x30) < 10));
    }
    else {
      bVar38 = false;
      pbVar36 = pbVar30;
    }
    lVar32 = (long)pbVar36 - (long)pbVar30;
    if ((bVar38) || (*pbVar36 != decimal_separator)) {
      local_40 = (byte *)0x0;
      pbVar24 = pbVar36;
    }
    else {
      local_40 = pbVar36 + 1;
      pbVar25 = pbVar36 + 9;
      pbVar24 = local_40;
      if (pbVar25 <= last) {
        unaff_R13 = (byte *)0xcfcfcfcfcfcfcfd0;
        uVar33 = *(long *)local_40 + 0xcfcfcfcfcfcfcfd0;
        if (((*(long *)local_40 + 0x4646464646464646U | uVar33) & 0x8080808080808080) == 0) {
          unaff_R13 = (byte *)0x4646464646464646;
          uVar33 = (uVar33 >> 8) + uVar33 * 10;
          in_R10 = ((uVar33 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar33 & 0xff000000ff) * 0xf424000000064 >> 0x20) + in_R10 * 100000000;
          pbVar24 = pbVar25;
          if (pbVar36 + 0x11 <= last) {
            uVar33 = *(long *)pbVar25 + 0xcfcfcfcfcfcfcfd0;
            unaff_R13 = (byte *)(*(long *)pbVar25 + 0x4646464646464646U | uVar33);
            if (((ulong)unaff_R13 & 0x8080808080808080) == 0) {
              uVar33 = (uVar33 >> 8) + uVar33 * 10;
              unaff_R13 = (byte *)0xf424000000064;
              in_R10 = ((uVar33 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                        (uVar33 & 0xff000000ff) * 0xf424000000064 >> 0x20) + in_R10 * 100000000;
              pbVar24 = pbVar36 + 0x11;
            }
          }
        }
      }
      lVar37 = 0;
      do {
        if ((pbVar24 == (byte *)last) || (9 < (byte)(*pbVar24 - 0x30))) {
          local_40 = local_40 + (lVar37 - (long)pbVar24);
          lVar32 = lVar32 - (long)local_40;
          bVar38 = true;
          goto LAB_0029acef;
        }
        pbVar25 = pbVar24 + 1;
        uVar35 = (undefined7)((ulong)unaff_R13 >> 8);
        if (pbVar25 == (byte *)last) {
          unaff_R13 = (byte *)CONCAT71(uVar35,1);
        }
        else {
          unaff_R13 = (byte *)CONCAT71(uVar35,*pbVar25 != 0x5f);
          if (*pbVar25 == 0x5f && !strict) {
            pbVar25 = pbVar24 + 2;
            lVar37 = lVar37 + 1;
            if (pbVar25 == (byte *)last) {
              unaff_R13 = (byte *)0x0;
            }
            else {
              unaff_R13 = (byte *)CONCAT71(uVar35,(byte)(*pbVar25 - 0x30) < 10);
            }
          }
        }
        in_R10 = (ulong)(byte)(*pbVar24 - 0x30) + in_R10 * 10;
        pbVar24 = pbVar25;
      } while ((char)unaff_R13 != '\0');
      local_40 = (byte *)0x0;
      bVar38 = false;
LAB_0029acef:
      if (!bVar38) goto LAB_0029af4f;
    }
    if (lVar32 != 0) {
      if ((((fmt & scientific) == 0) || (pbVar24 == (byte *)last)) || ((*pbVar24 | 0x20) != 0x65)) {
        if ((fmt & general) == scientific) goto LAB_0029af4f;
        unaff_R13 = (byte *)0x0;
      }
      else {
        pbVar25 = pbVar24 + 1;
        if (pbVar25 == (byte *)last) {
LAB_0029ad0e:
          bVar38 = false;
        }
        else {
          if (*pbVar25 != 0x2d) {
            if (*pbVar25 == 0x2b) {
              pbVar25 = pbVar24 + 2;
            }
            goto LAB_0029ad0e;
          }
          pbVar25 = pbVar24 + 2;
          bVar38 = true;
        }
        if ((pbVar25 == (byte *)last) || (9 < (byte)(*pbVar25 - 0x30))) {
          uVar27 = fmt >> 2 & 1;
          cVar28 = (char)uVar27;
          if (uVar27 == 0) {
            pbVar24 = pbVar25;
          }
          unaff_R13 = (byte *)0x0;
        }
        else {
          pbVar34 = (byte *)0x0;
          pbVar24 = pbVar25;
          do {
            if ((pbVar24 == (byte *)last) || (9 < (byte)(*pbVar24 - 0x30))) {
              unaff_R13 = (byte *)-(long)pbVar34;
              if (!bVar38) {
                unaff_R13 = pbVar34;
              }
              local_40 = local_40 + (long)unaff_R13;
              cVar28 = '\x01';
              goto LAB_0029ae79;
            }
            unaff_R13 = (byte *)((ulong)(byte)(*pbVar24 - 0x30) + (long)pbVar34 * 10);
            if (0xffff < (long)pbVar34) {
              unaff_R13 = pbVar34;
            }
            pbVar25 = pbVar24 + 1;
            if (pbVar25 == (byte *)last) {
              bVar39 = true;
            }
            else {
              bVar39 = *pbVar25 != 0x5f;
              if (!bVar39 && !strict) {
                pbVar25 = pbVar24 + 2;
                if (pbVar25 == (byte *)last) {
                  bVar39 = false;
                }
                else {
                  bVar39 = (byte)(*pbVar25 - 0x30) < 10;
                }
              }
            }
            pbVar24 = pbVar25;
            pbVar34 = unaff_R13;
          } while (bVar39);
          cVar28 = '\0';
        }
LAB_0029ae79:
        if (cVar28 == '\0') goto LAB_0029af4f;
      }
      bVar38 = true;
      pbVar25 = pbVar30;
      if (0x13 < lVar32) {
        do {
          bVar2 = *pbVar25;
          if (bVar2 != 0x30 && bVar2 != decimal_separator) break;
          lVar32 = lVar32 - (ulong)(bVar2 == 0x30);
          pbVar25 = pbVar25 + 1;
        } while (pbVar25 != (byte *)last);
        if (0x13 < lVar32) {
          in_R10 = 0;
          while ((byte)(*pbVar30 - 0x30) < 10) {
            in_R10 = ((ulong)*pbVar30 + in_R10 * 10) - 0x30;
            pbVar25 = pbVar30 + 1;
            if (((pbVar25 != (byte *)last) && (*pbVar25 == 0x5f)) &&
               ((strict ||
                ((pbVar25 = pbVar30 + 2, pbVar25 == (byte *)last || (9 < (byte)(*pbVar25 - 0x30)))))
               )) goto LAB_0029b366;
            pbVar30 = pbVar25;
            if ((999999999999999999 < in_R10) || (pbVar30 == (byte *)last)) break;
          }
          if (in_R10 < 1000000000000000000) {
            pbVar30 = pbVar30 + 1;
            lVar32 = 0;
            pbVar25 = pbVar30;
            pbVar36 = pbVar30;
            if (pbVar30 != (byte *)last) {
              while (pbVar25 = pbVar36, (byte)(*pbVar36 - 0x30) < 10) {
                in_R10 = ((ulong)*pbVar36 + in_R10 * 10) - 0x30;
                pbVar25 = pbVar36 + 1;
                if ((pbVar25 != (byte *)last) && (*pbVar25 == 0x5f)) {
                  pbVar25 = pbVar36 + 2;
                  if ((pbVar25 == (byte *)last) || (9 < (byte)(*pbVar25 - 0x30))) goto LAB_0029b366;
                  lVar32 = lVar32 + 1;
                }
                if ((999999999999999999 < in_R10) || (pbVar36 = pbVar25, pbVar25 == (byte *)last))
                break;
              }
            }
            unaff_R13 = pbVar30 + (long)(unaff_R13 + (lVar32 - (long)pbVar25));
          }
          else {
            unaff_R13 = pbVar36 + ((long)unaff_R13 - (long)pbVar30);
          }
          bVar39 = true;
          bVar38 = true;
          goto LAB_0029af52;
        }
      }
      bVar39 = false;
      unaff_R13 = local_40;
      goto LAB_0029af52;
    }
  }
LAB_0029af4f:
  bVar39 = false;
  bVar38 = false;
LAB_0029af52:
  if (!bVar38) {
    fVar42 = detail::parse_infnan<float>(first,last,value);
    return fVar42;
  }
  if ((in_R10 < 0x1000001 && !bVar39) && (byte *)0xffffffffffffffea < unaff_R13 + -0xb) {
    fVar40 = (float)in_R10;
    *value = fVar40;
    if ((long)unaff_R13 < 0) {
      fVar40 = fVar40 / *(float *)(powers_of_ten_float + (long)unaff_R13 * -4);
    }
    else {
      fVar40 = fVar40 * *(float *)(powers_of_ten_float + (long)unaff_R13 * 4);
    }
    fVar15._8_8_ = 0;
    fVar15.ptr = (char *)pbVar24;
    fVar14._8_8_ = 0;
    fVar14.ptr = (char *)pbVar24;
    *value = fVar40;
    if (cVar1 != '-') {
      return fVar14;
    }
    *value = -fVar40;
    return fVar15;
  }
  uVar27 = 0;
  iVar31 = (int)unaff_R13;
  if (in_R10 == 0) {
LAB_0029af9f:
    uVar18 = 0;
  }
  else {
    uVar18 = 0;
    uVar27 = 0;
    if (-0x42 < (long)unaff_R13) {
      if (0x26 < (long)unaff_R13) {
        uVar27 = 0xff;
        goto LAB_0029af9f;
      }
      uVar33 = 0x3f;
      if (in_R10 != 0) {
        for (; in_R10 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar22 = in_R10 << ((byte)(uVar33 ^ 0x3f) & 0x3f);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar22;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar31 * 2 + 0x2ac) * 8);
      auVar11 = auVar3 * auVar7;
      uVar23 = auVar11._8_8_;
      if ((~uVar23 & 0x3fffffffff) == 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar22;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar31 * 2 + 0x2ad) * 8);
        uVar23 = SUB168(auVar4 * auVar8,8);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar23;
        auVar16 = auVar11 + auVar16;
        auVar11._8_8_ = uVar23;
        auVar11._0_8_ = auVar16._0_8_;
        uVar23 = auVar16._8_8_;
      }
      if ((unaff_R13 + 0x1b < (byte *)0x53) || (auVar11._0_8_ != 0xffffffffffffffff)) {
        iVar19 = ((iVar31 * 0x3526a >> 0x10) - (int)(uVar33 ^ 0x3f)) - (int)((long)uVar23 >> 0x3f);
        iVar26 = iVar19 + 0xbe;
        bVar2 = (byte)(uVar23 >> 0x3f);
        uVar33 = uVar23 >> (bVar2 | 0x26);
        if (iVar26 < 1) {
          if (iVar26 < -0x3e) {
            uVar27 = 0;
            goto LAB_0029af9f;
          }
          uVar33 = (uVar33 >> ((byte)(1U - iVar26) & 0x3f)) +
                   (ulong)((uVar33 >> ((ulong)(1U - iVar26) & 0x3f) & 1) != 0);
          uVar18 = (uint)(uVar33 >> 1) & 0x7fffffff;
          uVar27 = (uint)(0xffffff < uVar33);
        }
        else {
          uVar22 = (ulong)((uint)uVar33 & 0x3fffffe);
          if (uVar33 << (bVar2 | 0x26) != uVar23 || ((uint)uVar33 & 3) != 1) {
            uVar22 = uVar33;
          }
          if ((byte *)0x1b < unaff_R13 + 0x11) {
            uVar22 = uVar33;
          }
          if (1 < auVar11._0_8_) {
            uVar22 = uVar33;
          }
          uVar22 = ((uint)uVar22 & 1) + uVar22;
          uVar27 = (iVar19 + 0xbf) - (uint)(uVar22 < 0x2000000);
          uVar18 = (uint)(uVar22 >> 1) & 0x37fffff;
          if (0x1ffffff < uVar22) {
            uVar18 = 0;
          }
          if (0xfe < (int)uVar27) {
            uVar18 = 0;
            uVar27 = 0xff;
          }
        }
      }
      else {
        uVar18 = 0;
        uVar27 = 0xffffffff;
      }
    }
  }
  if (!bVar39) goto LAB_0029afdd;
  uVar20 = 0;
  uVar33 = in_R10 + 1;
  if (uVar33 == 0) {
LAB_0029afc8:
    uVar21 = 0;
  }
  else {
    uVar21 = 0;
    if (-0x42 < (long)unaff_R13) {
      if (0x26 < (long)unaff_R13) {
        uVar20 = 0xff;
        goto LAB_0029afc8;
      }
      uVar23 = 0x3f;
      if (uVar33 != 0) {
        for (; uVar33 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar33 = uVar33 << ((byte)(uVar23 ^ 0x3f) & 0x3f);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar33;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar31 * 2 + 0x2ac) * 8);
      auVar12 = auVar5 * auVar9;
      uVar22 = auVar12._8_8_;
      if ((~uVar22 & 0x3fffffffff) == 0) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar33;
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar31 * 2 + 0x2ad) * 8);
        uVar33 = SUB168(auVar6 * auVar10,8);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar33;
        auVar17 = auVar12 + auVar17;
        auVar12._8_8_ = uVar33;
        auVar12._0_8_ = auVar17._0_8_;
        uVar22 = auVar17._8_8_;
      }
      if ((unaff_R13 + 0x1b < (byte *)0x53) || (auVar12._0_8_ != 0xffffffffffffffff)) {
        iVar31 = ((iVar31 * 0x3526a >> 0x10) - (int)(uVar23 ^ 0x3f)) - (int)((long)uVar22 >> 0x3f);
        iVar19 = iVar31 + 0xbe;
        bVar2 = (byte)(uVar22 >> 0x3f);
        uVar33 = uVar22 >> (bVar2 | 0x26);
        if (iVar19 < 1) {
          if (iVar19 < -0x3e) {
            uVar20 = 0;
            goto LAB_0029afc8;
          }
          uVar33 = (uVar33 >> ((byte)(1U - iVar19) & 0x3f)) +
                   (ulong)((uVar33 >> ((ulong)(1U - iVar19) & 0x3f) & 1) != 0);
          uVar20 = (uint)(0xffffff < uVar33);
          uVar21 = (uint)uVar33 >> 1;
        }
        else {
          uVar23 = (ulong)((uint)uVar33 & 0x3fffffe);
          if (uVar33 << (bVar2 | 0x26) != uVar22 || ((uint)uVar33 & 3) != 1) {
            uVar23 = uVar33;
          }
          if ((byte *)0x1b < unaff_R13 + 0x11) {
            uVar23 = uVar33;
          }
          if (1 < auVar12._0_8_) {
            uVar23 = uVar33;
          }
          uVar23 = ((uint)uVar23 & 1) + uVar23;
          uVar20 = (iVar31 + 0xbf) - (uint)(uVar23 < 0x2000000);
          uVar21 = (uint)(uVar23 >> 1) & 0x37fffff;
          if (0x1ffffff < uVar23) {
            uVar21 = 0;
          }
          if (0xfe < (int)uVar20) {
            uVar20 = 0xff;
            uVar21 = 0;
          }
        }
      }
      else {
        uVar20 = 0xffffffff;
        uVar21 = 0;
      }
    }
  }
  if (uVar27 != uVar20) {
    uVar27 = 0xffffffff;
  }
  if (uVar18 != uVar21) {
    uVar27 = 0xffffffff;
  }
LAB_0029afdd:
  if ((int)uVar27 < 0) {
    aVar41 = parse_long_mantissa<duckdb_fast_float::binary_format<float>>(first,last);
    uVar18 = (uint)aVar41.mantissa;
    uVar27 = aVar41.power2;
  }
  fVar29 = (float)(uVar18 | uVar27 << 0x17);
  fVar40 = (float)((uint)fVar29 | 0x80000000);
  if (cVar1 != '-') {
    fVar40 = fVar29;
  }
  *value = fVar40;
  fVar13._8_8_ = 0;
  fVar13.ptr = (char *)pbVar24;
  return fVar13;
LAB_0029b366:
  bVar39 = true;
  bVar38 = false;
  unaff_R13 = local_40;
  goto LAB_0029af52;
}

Assistant:

from_chars_result from_chars(const char *first, const char *last,
                             T &value, bool strict, const char decimal_separator, chars_format fmt
                              /*= chars_format::general*/)  noexcept  {
  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");


  from_chars_result answer;
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string pns = parse_number_string(first, last, decimal_separator, fmt, strict);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }
  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // Next is Clinger's fast path.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && pns.mantissa <=binary_format<T>::max_mantissa_fast_path() && !pns.too_many_digits) {
    value = T(pns.mantissa);
    if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
    else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
    if (pns.negative) { value = -value; }
    return answer;
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am.power2 = -1; // value is invalid.
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = parse_long_mantissa<binary_format<T>>(first,last); }
  detail::to_float(pns.negative, am, value);
  return answer;
}